

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::descriptor_set_layout_is_supported
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  uint uVar1;
  VkDescriptorType VVar2;
  uint32_t uVar3;
  VkBool32 VVar4;
  DeviceQueryInterface *pDVar5;
  bool bVar6;
  char cVar7;
  size_type sVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint *puVar13;
  int iVar14;
  uint32_t j;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  VkBaseInStructure *sin;
  int *piVar18;
  VkDescriptorSetLayoutBinding *pVVar19;
  uint local_a0;
  byte local_9a;
  byte local_99;
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_95;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  allocator local_75;
  uint local_74;
  ulong local_70;
  ulong local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  key_type local_50;
  
  if ((info->flags & 0xffffff0c) != 0) {
    return false;
  }
  if (this->null_device != false) {
    return true;
  }
  if ((info->flags & 1) != 0) {
    std::__cxx11::string::string
              ((string *)&local_50,"VK_KHR_push_descriptor",(allocator *)&local_a0);
    sVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this,&local_50);
    if (sVar8 == 0) {
      VVar4 = (this->features).vk14.pushDescriptor;
      std::__cxx11::string::_M_dispose();
      if (VVar4 == 0) {
        return false;
      }
    }
    else {
      std::__cxx11::string::_M_dispose();
    }
  }
  if ((info->flags & 2) != 0) {
    std::__cxx11::string::string
              ((string *)&local_50,"VK_EXT_descriptor_indexing",(allocator *)&local_a0);
    sVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)this,&local_50);
    if (sVar8 == 0) {
      VVar4 = (this->features).vk12.descriptorIndexing;
      std::__cxx11::string::_M_dispose();
      if (VVar4 == 0) {
        return false;
      }
    }
    else {
      std::__cxx11::string::_M_dispose();
    }
  }
  local_60 = info->flags;
  if ((local_60 & 0x30) != 0) {
    if ((this->features).descriptor_buffer.descriptorBuffer == 0) {
      return false;
    }
    if (((local_60 & 1) != 0) &&
       ((this->features).descriptor_buffer.descriptorBufferPushDescriptors == 0)) {
      return false;
    }
  }
  if (((char)local_60 < '\0') &&
     ((this->features).device_generated_commands_compute_nv.deviceGeneratedCompute == 0)) {
    return false;
  }
  if (((local_60 & 0x40) != 0) &&
     ((this->features).per_stage_descriptor_set_nv.perStageDescriptorSet == 0)) {
    return false;
  }
  local_a0 = 0;
  local_90 = 0;
  local_88 = 0;
  local_8c = 0;
  local_7c = 0;
  local_80 = 0;
  local_74 = 0;
  local_94 = 0;
  local_84 = 0;
  piVar18 = (int *)info->pNext;
  for (piVar17 = piVar18; (piVar17 != (int *)0x0 && (*piVar17 != 0x3b9d3ee8));
      piVar17 = *(int **)(piVar17 + 2)) {
  }
  for (; (piVar18 != (int *)0x0 && (*piVar18 != 0x3ba0251a)); piVar18 = *(int **)(piVar18 + 2)) {
  }
  uVar10 = 0;
  uVar12 = 0;
  local_58 = 0;
  do {
    if (info->bindingCount <= uVar10) {
      VVar4 = (this->features).maintenance7.maintenance7;
      if ((local_60 & 2) == 0) {
        if (VVar4 == 0) {
          if ((this->props2).properties.limits.maxDescriptorSetUniformBuffersDynamic < local_74) {
            return false;
          }
          if ((this->props2).properties.limits.maxDescriptorSetStorageBuffersDynamic < local_94) {
            return false;
          }
        }
        else {
          if ((this->props).maintenance7.maxDescriptorSetTotalUniformBuffersDynamic < local_74) {
            return false;
          }
          if ((this->props).maintenance7.maxDescriptorSetTotalStorageBuffersDynamic < local_94) {
            return false;
          }
          if ((this->props).maintenance7.maxDescriptorSetTotalBuffersDynamic < local_94 + local_74)
          {
            return false;
          }
        }
        if ((this->props2).properties.limits.maxDescriptorSetUniformBuffers < local_8c) {
          return false;
        }
        if ((this->props2).properties.limits.maxDescriptorSetStorageBuffers < local_88) {
          return false;
        }
        if ((this->props2).properties.limits.maxDescriptorSetSampledImages < local_a0) {
          return false;
        }
        if ((this->props2).properties.limits.maxDescriptorSetStorageImages < local_90) {
          return false;
        }
        if ((this->props2).properties.limits.maxDescriptorSetSamplers < local_80) {
          return false;
        }
        if ((this->props2).properties.limits.maxDescriptorSetInputAttachments < local_7c) {
          return false;
        }
        uVar1 = (this->props).acceleration_structure.maxDescriptorSetAccelerationStructures;
      }
      else {
        if (VVar4 == 0) {
          if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic
              < local_74) {
            return false;
          }
          if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic
              < local_94) {
            return false;
          }
        }
        else {
          if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic <
              local_74) {
            return false;
          }
          if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic <
              local_94) {
            return false;
          }
          if ((this->props).maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic <
              local_94 + local_74) {
            return false;
          }
        }
        if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers <
            local_8c) {
          return false;
        }
        uVar1 = (this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers;
        if (uVar1 < local_88) {
          return false;
        }
        if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages <
            local_a0) {
          return false;
        }
        if (uVar1 < local_90) {
          return false;
        }
        if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers < local_80) {
          return false;
        }
        if ((this->props).descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments <
            local_7c) {
          return false;
        }
        uVar1 = (this->props).acceleration_structure.
                maxDescriptorSetUpdateAfterBindAccelerationStructures;
      }
      if (((local_84 <= uVar1) &&
          (((info->flags & 1) == 0 || (uVar12 <= (this->props).push_descriptor.maxPushDescriptors)))
          ) && (((local_58 & 1) == 0 ||
                ((pDVar5 = this->query, pDVar5 == (DeviceQueryInterface *)0x0 ||
                 (cVar7 = (**(code **)(*(long *)pDVar5 + 0x18))(pDVar5,info), cVar7 != '\0')))))) {
        bVar6 = pnext_chain_is_supported(this,info->pNext);
        return bVar6;
      }
      return false;
    }
    pVVar19 = info->pBindings;
    local_68 = uVar10;
    local_5c = uVar12;
    bVar6 = shader_stage_mask_is_supported(this,pVVar19[uVar10].stageFlags);
    if (!bVar6) {
      return false;
    }
    if (piVar17 == (int *)0x0) {
LAB_00182231:
      bVar9 = 0;
    }
    else {
      uVar12 = *(uint *)(*(long *)(piVar17 + 6) + local_68 * 4);
      if (0xf < uVar12) {
        return false;
      }
      if ((uint)piVar17[4] <= local_68) goto LAB_00182231;
      bVar9 = (byte)uVar12 & 1;
    }
    VVar2 = pVVar19[uVar10].descriptorType;
    switch(VVar2) {
    case VK_DESCRIPTOR_TYPE_SAMPLER:
      bVar6 = (this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == 0
      ;
      puVar13 = &local_80;
      break;
    case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
    case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
      VVar4 = (this->features).descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind;
      goto LAB_0018230a;
    case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
      VVar4 = (this->features).descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind;
      goto LAB_001824ce;
    case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
      VVar4 = (this->features).descriptor_indexing.
              descriptorBindingUniformTexelBufferUpdateAfterBind;
LAB_0018230a:
      bVar6 = VVar4 == 0;
      puVar13 = &local_a0;
      break;
    case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
      VVar4 = (this->features).descriptor_indexing.
              descriptorBindingStorageTexelBufferUpdateAfterBind;
LAB_001824ce:
      bVar6 = VVar4 == 0;
      puVar13 = &local_90;
      break;
    case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
      bVar6 = (this->features).descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind ==
              0;
      puVar13 = &local_8c;
      break;
    case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
      bVar6 = (this->features).descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind ==
              0;
      puVar13 = &local_88;
      break;
    case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
      puVar13 = &local_74;
      goto LAB_001824fc;
    case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
      puVar13 = &local_94;
      goto LAB_001824fc;
    case VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT:
      puVar13 = &local_7c;
LAB_001824fc:
      if (bVar9 != 0) {
        return false;
      }
      goto LAB_00182504;
    default:
      if (1 < VVar2 + 0xc45e7f40) {
        if (VVar2 == VK_DESCRIPTOR_TYPE_MUTABLE_EXT) {
          if (piVar18 == (int *)0x0) {
            return false;
          }
          if ((this->features).mutable_descriptor_type.mutableDescriptorType == 0) {
            return false;
          }
          iVar11 = 0;
          if ((uint)piVar18[4] <= local_68) {
            return false;
          }
          local_95 = (this->features).descriptor_indexing.
                     descriptorBindingStorageTexelBufferUpdateAfterBind == 0 & bVar9;
          local_96 = (this->features).descriptor_indexing.
                     descriptorBindingStorageImageUpdateAfterBind == 0 & bVar9;
          local_97 = (this->features).descriptor_indexing.
                     descriptorBindingUniformTexelBufferUpdateAfterBind == 0 & bVar9;
          local_98 = (this->features).descriptor_indexing.
                     descriptorBindingSampledImageUpdateAfterBind == 0 & bVar9;
          local_99 = (this->features).descriptor_indexing.
                     descriptorBindingUniformBufferUpdateAfterBind == 0 & bVar9;
          local_9a = (this->features).descriptor_indexing.
                     descriptorBindingStorageBufferUpdateAfterBind == 0 & bVar9;
          iVar14 = 0;
          local_70 = local_70 & 0xffffffff00000000;
          iVar16 = 0;
          for (uVar15 = 0; *(uint *)(*(long *)(piVar18 + 6) + local_68 * 0x10) != uVar15;
              uVar15 = uVar15 + 1) {
            switch(*(undefined4 *)
                    (*(long *)(*(long *)(piVar18 + 6) + local_68 * 0x10 + 8) + uVar15 * 4)) {
            case 0:
              local_58 = 1;
              iVar11 = 1;
              goto LAB_0018246d;
            default:
              return false;
            case 2:
              iVar11 = 1;
              bVar9 = local_98;
              goto joined_r0x00182433;
            case 3:
              iVar14 = 1;
              bVar9 = local_96;
joined_r0x00182433:
              if (bVar9 != 0) {
                return false;
              }
              goto LAB_0018246d;
            case 4:
              iVar11 = 1;
              bVar9 = local_97;
              break;
            case 5:
              iVar14 = 1;
              bVar9 = local_95;
              break;
            case 6:
              iVar16 = 1;
              bVar9 = local_99;
              break;
            case 7:
              local_70 = CONCAT44(local_70._4_4_,1);
              bVar9 = local_9a;
            }
            if (bVar9 != 0) {
              return false;
            }
LAB_0018246d:
          }
          uVar3 = pVVar19[uVar10].descriptorCount;
          local_a0 = local_a0 + iVar11 * uVar3;
          local_90 = local_90 + iVar14 * uVar3;
          local_8c = local_8c + iVar16 * uVar3;
          local_88 = local_88 + (int)local_70 * uVar3;
          goto LAB_0018250b;
        }
        if (VVar2 != VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR) {
          if (VVar2 != VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK) {
            return false;
          }
          if ((this->features).inline_uniform_block.inlineUniformBlock == 0) {
            return false;
          }
          if ((this->props).inline_uniform_block.maxInlineUniformBlockSize <
              pVVar19[uVar10].descriptorCount) {
            return false;
          }
          if ((bVar9 & (this->features).inline_uniform_block.
                       descriptorBindingInlineUniformBlockUpdateAfterBind == 0) != 0) {
            return false;
          }
          goto LAB_0018250b;
        }
        if ((bVar9 & (this->features).acceleration_structure.
                     descriptorBindingAccelerationStructureUpdateAfterBind == 0) != 0) {
          return false;
        }
        puVar13 = &local_84;
        if ((this->features).acceleration_structure.accelerationStructure == 0) {
          return false;
        }
        goto LAB_00182504;
      }
      std::__cxx11::string::string((string *)&local_50,"VK_QCOM_image_processing",&local_75);
      local_70 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,&local_50);
      std::__cxx11::string::_M_dispose();
      if (local_70 == 0) {
        return false;
      }
      pVVar19 = info->pBindings;
      goto LAB_0018250b;
    }
    if ((bVar9 & bVar6) != 0) {
      return false;
    }
LAB_00182504:
    *puVar13 = *puVar13 + pVVar19[uVar10].descriptorCount;
LAB_0018250b:
    uVar12 = local_5c + pVVar19[uVar10].descriptorCount;
    uVar10 = local_68 + 1;
  } while( true );
}

Assistant:

bool FeatureFilter::Impl::descriptor_set_layout_is_supported(const VkDescriptorSetLayoutCreateInfo *info) const
{
	bool must_check_set_layout_before_accept = false;

	// Only allow flags we recognize and validate.
	constexpr VkDescriptorSetLayoutCreateFlags supported_flags =
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV |
			VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV;

	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0)
	{
		if (enabled_extensions.count(VK_KHR_PUSH_DESCRIPTOR_EXTENSION_NAME) == 0 && features.vk14.pushDescriptor == 0)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0)
	{
		// There doesn't seem to be a specific feature bit for this flag, key it on extension being enabled.
		// For specific descriptor types, we check the individual features.
		if (enabled_extensions.count(VK_EXT_DESCRIPTOR_INDEXING_EXTENSION_NAME) == 0 && !features.vk12.descriptorIndexing)
			return false;
	}

	if ((info->flags & (VK_DESCRIPTOR_SET_LAYOUT_CREATE_EMBEDDED_IMMUTABLE_SAMPLERS_BIT_EXT |
	                    VK_DESCRIPTOR_SET_LAYOUT_CREATE_DESCRIPTOR_BUFFER_BIT_EXT)) != 0)
	{
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

		if (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR)
		{
			if (!features.descriptor_buffer.descriptorBufferPushDescriptors)
				return false;
		}
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_INDIRECT_BINDABLE_BIT_NV) != 0 &&
	    features.device_generated_commands_compute_nv.deviceGeneratedCompute == VK_FALSE)
		return false;

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PER_STAGE_BIT_NV) != 0 &&
	    features.per_stage_descriptor_set_nv.perStageDescriptorSet == VK_FALSE)
		return false;

	struct DescriptorCounts
	{
		uint32_t sampled_image;
		uint32_t storage_image;
		uint32_t ssbo;
		uint32_t ubo;
		uint32_t input_attachment;
		uint32_t sampler;
		uint32_t ubo_dynamic;
		uint32_t ssbo_dynamic;
		uint32_t acceleration_structure;
	};
	DescriptorCounts counts = {};
	uint32_t total_count = 0;

	auto *flags = find_pnext<VkDescriptorSetLayoutBindingFlagsCreateInfo>(
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO,
			info->pNext);

	auto *mutable_info = find_pnext<VkMutableDescriptorTypeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT,
			info->pNext);

	bool pool_is_update_after_bind = (info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_UPDATE_AFTER_BIND_POOL_BIT) != 0;

	for (unsigned i = 0; i < info->bindingCount; i++)
	{
		if (!shader_stage_mask_is_supported(info->pBindings[i].stageFlags))
			return false;

		constexpr VkDescriptorBindingFlags supported_binding_flags =
				VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT |
				VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT |
				VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT |
				VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT;

		if (flags && (flags->pBindingFlags[i] & ~supported_binding_flags) != 0)
			return false;

		bool binding_is_update_after_bind =
				flags && i < flags->bindingCount &&
				(flags->pBindingFlags[i] & VK_DESCRIPTOR_BINDING_UPDATE_AFTER_BIND_BIT) != 0;

		uint32_t *count = nullptr;

		switch (info->pBindings[i].descriptorType)
		{
		case VK_DESCRIPTOR_TYPE_INLINE_UNIFORM_BLOCK_EXT:
			if (features.inline_uniform_block.inlineUniformBlock == VK_FALSE)
				return false;
			// TODO: maxInlineUniformTotalSize, but this shouldn't matter when we use the EXT.
			if (info->pBindings[i].descriptorCount > props.inline_uniform_block.maxInlineUniformBlockSize)
				return false;
			if (binding_is_update_after_bind && features.inline_uniform_block.descriptorBindingInlineUniformBlockUpdateAfterBind == VK_FALSE)
				return false;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ssbo;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.ubo;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
		case VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampled_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.storage_image;
			break;

		case VK_DESCRIPTOR_TYPE_SAMPLER:
			if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
				return false;
			count = &counts.sampler;
			break;

		case VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.input_attachment;
			break;

		case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ubo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
			if (binding_is_update_after_bind)
				return false;
			count = &counts.ssbo_dynamic;
			break;

		case VK_DESCRIPTOR_TYPE_ACCELERATION_STRUCTURE_KHR:
			if (binding_is_update_after_bind &&
			    features.acceleration_structure.descriptorBindingAccelerationStructureUpdateAfterBind == VK_FALSE)
				return false;
			if (features.acceleration_structure.accelerationStructure == VK_FALSE)
				return false;
			count = &counts.acceleration_structure;
			break;

		case VK_DESCRIPTOR_TYPE_MUTABLE_EXT:
		{
			DescriptorCounts mutable_counts = {};
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;
			if (!mutable_info || i >= mutable_info->mutableDescriptorTypeListCount)
				return false;

			auto &list = mutable_info->pMutableDescriptorTypeLists[i];

			for (uint32_t j = 0; j < list.descriptorTypeCount; j++)
			{
				switch (list.pDescriptorTypes[j])
				{
				case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ssbo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.ubo = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingSampledImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingUniformTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.sampled_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageImageUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					if (binding_is_update_after_bind && features.descriptor_indexing.descriptorBindingStorageTexelBufferUpdateAfterBind == VK_FALSE)
						return false;
					mutable_counts.storage_image = 1;
					break;

				case VK_DESCRIPTOR_TYPE_SAMPLER:
					// Sampler is a non-standard type for mutable
					mutable_counts.sampled_image = 1;
					must_check_set_layout_before_accept = true;
					break;

				default:
					return false;
				}
			}

			counts.sampled_image += info->pBindings[i].descriptorCount * mutable_counts.sampled_image;
			counts.storage_image += info->pBindings[i].descriptorCount * mutable_counts.storage_image;
			counts.ubo += info->pBindings[i].descriptorCount * mutable_counts.ubo;
			counts.ssbo += info->pBindings[i].descriptorCount * mutable_counts.ssbo;
			break;
		}

		case VK_DESCRIPTOR_TYPE_BLOCK_MATCH_IMAGE_QCOM:
		case VK_DESCRIPTOR_TYPE_SAMPLE_WEIGHT_IMAGE_QCOM:
			if (enabled_extensions.count(VK_QCOM_IMAGE_PROCESSING_EXTENSION_NAME) == 0)
				return false;
			// *shrug*
			count = nullptr;
			break;

		default:
			return false;
		}

		if (count)
			*count += info->pBindings[i].descriptorCount;
		total_count += info->pBindings[i].descriptorCount;
	}

	if (pool_is_update_after_bind)
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetUpdateAfterBindTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindUniformBuffers)
			return false;
		if (counts.ssbo > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampled_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSampledImages)
			return false;
		if (counts.storage_image > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindStorageBuffers)
			return false;
		if (counts.sampler > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindSamplers)
			return false;
		if (counts.input_attachment > props.descriptor_indexing.maxDescriptorSetUpdateAfterBindInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetUpdateAfterBindAccelerationStructures)
			return false;
	}
	else
	{
		if (features.maintenance7.maintenance7)
		{
			if (counts.ubo_dynamic > props.maintenance7.maxDescriptorSetTotalUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props.maintenance7.maxDescriptorSetTotalStorageBuffersDynamic)
				return false;
			if ((counts.ubo_dynamic + counts.ssbo_dynamic) > props.maintenance7.maxDescriptorSetTotalBuffersDynamic)
				return false;
		}
		else
		{
			if (counts.ubo_dynamic > props2.properties.limits.maxDescriptorSetUniformBuffersDynamic)
				return false;
			if (counts.ssbo_dynamic > props2.properties.limits.maxDescriptorSetStorageBuffersDynamic)
				return false;
		}
		if (counts.ubo > props2.properties.limits.maxDescriptorSetUniformBuffers)
			return false;
		if (counts.ssbo > props2.properties.limits.maxDescriptorSetStorageBuffers)
			return false;
		if (counts.sampled_image > props2.properties.limits.maxDescriptorSetSampledImages)
			return false;
		if (counts.storage_image > props2.properties.limits.maxDescriptorSetStorageImages)
			return false;
		if (counts.sampler > props2.properties.limits.maxDescriptorSetSamplers)
			return false;
		if (counts.input_attachment > props2.properties.limits.maxDescriptorSetInputAttachments)
			return false;
		if (counts.acceleration_structure > props.acceleration_structure.maxDescriptorSetAccelerationStructures)
			return false;
	}

	if ((info->flags & VK_DESCRIPTOR_SET_LAYOUT_CREATE_PUSH_DESCRIPTOR_BIT_KHR) != 0 &&
	    total_count > props.push_descriptor.maxPushDescriptors)
	{
		return false;
	}

	if (must_check_set_layout_before_accept)
	{
		if (query && !query->descriptor_set_layout_is_supported(info))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}